

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

edata_t * duckdb_je_extent_alloc_wrapper
                    (tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,void *new_addr,size_t size,
                    size_t alignment,_Bool zero,_Bool *commit,_Bool growing_retained)

{
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  edata_cache_t *edata_cache;
  void *pvVar5;
  edata_t *edata_00;
  byte bVar6;
  ehooks_t *in_RCX;
  tsdn_t *in_RDX;
  pac_t *in_RSI;
  _Bool *in_RDI;
  void *in_R8;
  size_t in_R9;
  uint uVar7;
  byte in_stack_00000008;
  byte *in_stack_00000010;
  byte in_stack_00000018;
  _Bool gdump_add;
  void *addr;
  size_t palignment;
  edata_t *edata;
  tsd_t *tsd;
  uint8_t state;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffef4;
  undefined2 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  undefined1 in_stack_ffffffffffffff07;
  uint in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  edata_cache_t *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  tsdn_t *in_stack_ffffffffffffff28;
  extent_state_t state_00;
  extent_pai_t in_stack_ffffffffffffff50;
  extent_head_state_t is_head;
  undefined6 in_stack_ffffffffffffff70;
  ehooks_t *ehooks_00;
  edata_cache_t *local_58;
  witness_tsdn_t *local_40;
  
  bVar6 = in_stack_00000008 & 1;
  bVar1 = in_stack_00000018 & 1;
  if (in_RDI == (_Bool *)0x0) {
    local_40 = (witness_tsdn_t *)0x0;
  }
  else {
    local_40 = (witness_tsdn_t *)(in_RDI + 0xa40);
  }
  ehooks_00 = in_RCX;
  witness_assert_depth_to_rank(local_40,WITNESS_RANK_CORE,(uint)(bVar1 != 0));
  state_00 = (extent_state_t)in_RCX;
  edata_cache = (edata_cache_t *)
                duckdb_je_edata_cache_get
                          (in_stack_ffffffffffffff28,
                           (edata_cache_t *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (edata_cache == (edata_cache_t *)0x0) {
    local_58 = (edata_cache_t *)0x0;
  }
  else {
    pvVar5 = ehooks_alloc(in_RDX,ehooks_00,in_R8,in_R9,
                          CONCAT17(bVar6,CONCAT16(bVar1,in_stack_ffffffffffffff70)),
                          (_Bool *)edata_cache,in_RDI);
    if (pvVar5 == (void *)0x0) {
      duckdb_je_edata_cache_put
                ((tsdn_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18,
                 (edata_t *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      local_58 = (edata_cache_t *)0x0;
    }
    else {
      local_58 = edata_cache;
      uVar3 = ecache_ind_get(&in_RSI->ecache_dirty);
      is_head = (extent_head_state_t)pvVar5;
      edata_00 = (edata_t *)duckdb_je_extent_sn_next(in_RSI);
      uVar4 = (uint)((duckdb_je_opt_retain & 1U) != 0);
      uVar8 = 0;
      uVar7 = (uint)(bVar6 & 1);
      edata_init((edata_t *)CONCAT44(uVar3,in_stack_ffffffffffffff20),
                 (uint)((ulong)edata_cache >> 0x20),
                 (void *)CONCAT44(in_stack_ffffffffffffff14,uVar4),
                 (ulong)in_stack_ffffffffffffff0c << 0x20,(_Bool)in_stack_ffffffffffffff07,
                 (uint)(*in_stack_00000010 & 1),(uint64_t)in_R8,state_00,
                 (_Bool)in_stack_fffffffffffffeff,(_Bool)in_stack_fffffffffffffefe,
                 in_stack_ffffffffffffff50,is_head);
      _Var2 = extent_register_impl
                        ((tsdn_t *)
                         CONCAT17(in_stack_fffffffffffffeff,
                                  CONCAT16(in_stack_fffffffffffffefe,
                                           CONCAT24(in_stack_fffffffffffffefc,uVar7))),
                         (pac_t *)CONCAT44(in_stack_fffffffffffffef4,uVar8),edata_00,false);
      if (_Var2) {
        duckdb_je_edata_cache_put
                  ((tsdn_t *)CONCAT44(uVar3,in_stack_ffffffffffffff20),edata_cache,
                   (edata_t *)CONCAT44(in_stack_ffffffffffffff14,uVar4));
        local_58 = (edata_cache_t *)0x0;
      }
    }
  }
  return (edata_t *)local_58;
}

Assistant:

edata_t *
extent_alloc_wrapper(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks,
    void *new_addr, size_t size, size_t alignment, bool zero, bool *commit,
    bool growing_retained) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, growing_retained ? 1 : 0);

	edata_t *edata = edata_cache_get(tsdn, pac->edata_cache);
	if (edata == NULL) {
		return NULL;
	}
	size_t palignment = ALIGNMENT_CEILING(alignment, PAGE);
	void *addr = ehooks_alloc(tsdn, ehooks, new_addr, size, palignment,
	    &zero, commit);
	if (addr == NULL) {
		edata_cache_put(tsdn, pac->edata_cache, edata);
		return NULL;
	}
	edata_init(edata, ecache_ind_get(&pac->ecache_dirty), addr,
	    size, /* slab */ false, SC_NSIZES, extent_sn_next(pac),
	    extent_state_active, zero, *commit, EXTENT_PAI_PAC,
	    opt_retain ? EXTENT_IS_HEAD : EXTENT_NOT_HEAD);
	/*
	 * Retained memory is not counted towards gdump.  Only if an extent is
	 * allocated as a separate mapping, i.e. growing_retained is false, then
	 * gdump should be updated.
	 */
	bool gdump_add = !growing_retained;
	if (extent_register_impl(tsdn, pac, edata, gdump_add)) {
		edata_cache_put(tsdn, pac->edata_cache, edata);
		return NULL;
	}

	return edata;
}